

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O0

void wasm::UniqueNameMapper::uniquify(Expression *curr)

{
  bool bVar1;
  undefined1 local_3a8 [8];
  Walker walker;
  undefined1 local_1d0 [8];
  DuplicateNameScanner scanner;
  Expression *curr_local;
  
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_single_bucket = (__node_base_ptr)curr;
  anon_unknown_23::DuplicateNameScanner::DuplicateNameScanner((DuplicateNameScanner *)local_1d0);
  Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  ::walk((Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
          *)local_1d0,
         (Expression **)
         &scanner.seen.
          super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
          .flexible._M_h._M_single_bucket);
  bVar1 = ((byte)scanner.
                 super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                 .currModule & 1) == 0;
  if (bVar1) {
    uniquify::Walker::Walker((Walker *)local_3a8);
    Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::walk
              ((Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_> *)local_3a8,
               (Expression **)
               &scanner.seen.
                super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
                .flexible._M_h._M_single_bucket);
    uniquify::Walker::~Walker((Walker *)local_3a8);
  }
  walker.mapper.otherIndex = (Index)!bVar1;
  anon_unknown_23::DuplicateNameScanner::~DuplicateNameScanner((DuplicateNameScanner *)local_1d0);
  return;
}

Assistant:

void UniqueNameMapper::uniquify(Expression* curr) {
  // First, scan the code to see if anything needs to be fixed up, since in the
  // common case nothing needs fixing, and we can verify that very quickly.
  DuplicateNameScanner scanner;
  scanner.walk(curr);
  if (scanner.ok) {
    return;
  }

  struct Walker
    : public ControlFlowWalker<Walker, UnifiedExpressionVisitor<Walker>> {
    UniqueNameMapper mapper;

    static void doPreVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          name = self->mapper.pushLabelName(name);
        }
      });
    }

    static void doPostVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          self->mapper.popLabelName(name);
        }
      });
    }

    void visitExpression(Expression* curr) {
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          name = mapper.sourceToUnique(name);
        }
      });
    }
  } walker;

  walker.walk(curr);
}